

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

bool amrex::anon_unknown_12::anon_unknown_0::squeryarr<double>
               (Table *table,string *name,vector<double,_std::allocator<double>_> *ptr,int start_ix,
               int num_val,int occurrence)

{
  bool bVar1;
  int iVar2;
  PP_entry *pPVar3;
  size_type sVar4;
  ostream *poVar5;
  const_reference os;
  char *pcVar6;
  int in_ECX;
  vector<double,_std::allocator<double>_> *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  int in_R8D;
  int in_R9D;
  bool ok;
  string *valname;
  int n;
  int stop_ix;
  PP_entry *def;
  double *in_stack_00000150;
  string *in_stack_00000158;
  undefined4 in_stack_ffffffffffffffa4;
  ostream *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar7;
  int local_38;
  int in_stack_ffffffffffffffec;
  Table *in_stack_fffffffffffffff0;
  
  pPVar3 = ppindex(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_RDI,
                   SUB81((ulong)in_RSI >> 0x38,0));
  if (pPVar3 == (PP_entry *)0x0) {
    bVar1 = false;
  }
  else {
    local_38 = in_R8D;
    if (in_R8D == -1) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pPVar3->m_vals);
      local_38 = (int)sVar4;
    }
    if (local_38 == 0) {
      bVar1 = true;
    }
    else {
      iVar2 = in_ECX + local_38 + -1;
      sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
      if ((int)sVar4 <= iVar2) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffffb0),(size_type)in_stack_ffffffffffffffa8);
      }
      iVar7 = iVar2;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pPVar3->m_vals);
      if ((int)sVar4 <= iVar2) {
        poVar5 = ErrorStream();
        std::operator<<(poVar5,"ParmParse::queryarr too many values requested for");
        if (in_R9D == -1) {
          poVar5 = ErrorStream();
          std::operator<<(poVar5," last occurrence of ");
        }
        else {
          poVar5 = ErrorStream();
          poVar5 = std::operator<<(poVar5," occurrence ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_R9D);
          std::operator<<(poVar5," of ");
        }
        poVar5 = ErrorStream();
        poVar5 = std::operator<<(poVar5,(string *)pPVar3);
        std::operator<<(poVar5,'\n');
        poVar5 = amrex::operator<<(in_stack_ffffffffffffffa8,
                                   (PP_entry *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
        std::operator<<(poVar5,'\n');
        Abort_host((char *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
      }
      for (; in_ECX <= iVar7; in_ECX = in_ECX + 1) {
        os = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&pPVar3->m_vals,(long)in_ECX);
        std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)in_ECX);
        bVar1 = is<double>(in_stack_00000158,in_stack_00000150);
        in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
        if (!bVar1) {
          poVar5 = ErrorStream();
          poVar5 = std::operator<<(poVar5,"ParmParse::queryarr type mismatch on value number ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_ECX);
          std::operator<<(poVar5," of ");
          if (in_R9D == -1) {
            poVar5 = ErrorStream();
            std::operator<<(poVar5," last occurrence of ");
          }
          else {
            poVar5 = ErrorStream();
            poVar5 = std::operator<<(poVar5," occurrence number ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_R9D);
            std::operator<<(poVar5," of ");
          }
          poVar5 = ErrorStream();
          poVar5 = std::operator<<(poVar5,(string *)pPVar3);
          std::operator<<(poVar5,'\n');
          poVar5 = ErrorStream();
          poVar5 = std::operator<<(poVar5," Expected an \"");
          pcVar6 = tok_name<double>((vector<double,_std::allocator<double>_> *)poVar5);
          poVar5 = std::operator<<(poVar5,pcVar6);
          poVar5 = std::operator<<(poVar5,"\" type which can\'t be parsed from the string \"");
          poVar5 = std::operator<<(poVar5,(string *)os);
          std::operator<<(poVar5,"\"\n");
          poVar5 = amrex::operator<<((ostream *)os,
                                     (PP_entry *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
          std::operator<<(poVar5,'\n');
          Abort_host((char *)CONCAT44(in_stack_ffffffffffffffa4,iVar2));
        }
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool
squeryarr (const ParmParse::Table& table,
           const std::string& name,
           std::vector<T>&    ptr,
           int          start_ix,
           int          num_val,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry *def = ppindex(table,occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have sufficient number of values and are they all
    // the same type?
    //
    if ( num_val == ParmParse::ALL )
    {
        num_val = def->m_vals.size();
    }

    if ( num_val == 0 ) return true;

    int stop_ix = start_ix + num_val - 1;
    if ( static_cast<int>(ptr.size()) <= stop_ix )
    {
        ptr.resize(stop_ix + 1);
    }
    if ( stop_ix >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryarr too many values requested for";
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }
    for ( int n = start_ix; n <= stop_ix; n++ )
    {
        const std::string& valname = def->m_vals[n];
        bool ok = is(valname, ptr[n]);
        if ( !ok )
        {
            amrex::ErrorStream() << "ParmParse::queryarr type mismatch on value number "
                      <<  n << " of ";
            if ( occurrence == ParmParse::LAST )
            {
                amrex::ErrorStream() << " last occurrence of ";
            }
            else
            {
                amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
            }
            amrex::ErrorStream() << def->m_name << '\n';
            amrex::ErrorStream() << " Expected an \""
                      << tok_name(ptr)
                      << "\" type which can't be parsed from the string \""
                      << valname << "\"\n"
                      << *def << '\n';
            amrex::Abort();
        }
    }
    return true;
}